

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

string * tonk::GetConnectionLogPrefix(string *__return_storage_ptr__,string *hostname,uint16_t port)

{
  ostream *poVar1;
  ostringstream oss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"[");
  poVar1 = std::operator<<(poVar1,(string *)hostname);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,port);
  std::operator<<(poVar1,"] ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetConnectionLogPrefix(const std::string& hostname, uint16_t port)
{
    std::ostringstream oss;
    oss << "[" << hostname << ":" << port << "] ";
    return oss.str();
}